

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall
helics::apps::Player::Player(Player *this,string_view appName,CoreApp *core,FederateInfo *fedInfo)

{
  string_view appName_00;
  char *in_RDX;
  size_t in_RSI;
  undefined8 *in_RDI;
  Player *this_00;
  FederateInfo *in_stack_ffffffffffffffb0;
  CoreApp *in_stack_ffffffffffffffb8;
  App *in_stack_ffffffffffffffc0;
  
  appName_00._M_str = in_RDX;
  appName_00._M_len = in_RSI;
  App::App(in_stack_ffffffffffffffc0,appName_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  *in_RDI = &PTR__Player_00a47078;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::vector
            ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             0x3d8580);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  vector((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
         0x3d8596);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x3d85ac);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x3d85c2);
  CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::deque
            ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)0x3d85d8);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x3d85f0);
  this_00 = (Player *)(in_RDI + 0x3b);
  CLI::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x3d8608);
  CLI::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x3d861e);
  *(undefined4 *)(in_RDI + 0x49) = 0;
  in_RDI[0x4a] = 0;
  in_RDI[0x4b] = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 5;
  in_RDI[0x4d] = 0x3ff0000000000000;
  in_RDI[0x4e] = 0;
  initialSetup(this_00);
  return;
}

Assistant:

Player::Player(std::string_view appName, CoreApp& core, const FederateInfo& fedInfo):
    App(appName, core, fedInfo)
{
    initialSetup();
}